

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedBreakIterator::RuleBasedBreakIterator
          (RuleBasedBreakIterator *this,RuleBasedBreakIterator *other)

{
  undefined4 local_68 [2];
  UErrorCode status;
  UnicodeString local_58;
  RuleBasedBreakIterator *local_18;
  RuleBasedBreakIterator *other_local;
  RuleBasedBreakIterator *this_local;
  
  local_18 = other;
  other_local = this;
  BreakIterator::BreakIterator(&this->super_BreakIterator,&other->super_BreakIterator);
  (this->super_BreakIterator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__RuleBasedBreakIterator_005c17a0;
  icu_63::UnicodeString::UnicodeString(&local_58);
  StringCharacterIterator::StringCharacterIterator(&this->fSCharIter,&local_58);
  icu_63::UnicodeString::~UnicodeString(&local_58);
  local_68[0] = 0;
  init(this,(EVP_PKEY_CTX *)local_68);
  operator=(this,local_18);
  return;
}

Assistant:

RuleBasedBreakIterator::RuleBasedBreakIterator(const RuleBasedBreakIterator& other)
: BreakIterator(other),
  fSCharIter(UnicodeString())
{
    UErrorCode status = U_ZERO_ERROR;
    this->init(status);
    *this = other;
}